

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O3

void __thiscall
chrono::fea::ChHexahedronFace::LoadableGetStateBlock_w
          (ChHexahedronFace *this,int block_offset,ChStateDelta *mD)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  ChLoadableUV local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  uVar3 = (ulong)(uint)block_offset;
  i = (int)this;
  GetNodeN((ChHexahedronFace *)&local_30,i);
  if ((block_offset < 0) ||
     ((mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)block_offset)) goto LAB_00634a6f;
  pdVar1 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           block_offset;
  uVar2 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar4 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar4 < 3) {
      uVar2 = (ulong)uVar4;
    }
    if (uVar4 != 0) goto LAB_00634868;
  }
  else {
LAB_00634868:
    uVar5 = 0;
    do {
      pdVar1[uVar5] = *(double *)((long)local_30 + 0x38 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (uVar2 < 3) {
    do {
      pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  GetNodeN((ChHexahedronFace *)&local_30,i);
  if ((mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(uVar3 + 3)) goto LAB_00634a6f;
  pdVar1 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar3 + 3;
  uVar2 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar4 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar4 < 3) {
      uVar2 = (ulong)uVar4;
    }
    if (uVar4 != 0) goto LAB_00634900;
  }
  else {
LAB_00634900:
    uVar5 = 0;
    do {
      pdVar1[uVar5] = *(double *)((long)local_30 + 0x38 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (uVar2 < 3) {
    do {
      pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  GetNodeN((ChHexahedronFace *)&local_30,i);
  if ((mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(uVar3 + 6)) goto LAB_00634a6f;
  pdVar1 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar3 + 6;
  uVar2 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar4 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar4 < 3) {
      uVar2 = (ulong)uVar4;
    }
    if (uVar4 != 0) goto LAB_00634995;
  }
  else {
LAB_00634995:
    uVar5 = 0;
    do {
      pdVar1[uVar5] = *(double *)((long)local_30 + 0x38 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (uVar2 < 3) {
    do {
      pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  GetNodeN((ChHexahedronFace *)&local_30,i);
  if ((mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(uVar3 + 9)) {
LAB_00634a6f:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar1 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar3 + 9;
  uVar3 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar4 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar4 < 3) {
      uVar3 = (ulong)uVar4;
    }
    if (uVar4 == 0) goto LAB_00634a3b;
  }
  uVar2 = 0;
  do {
    pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
    uVar2 = uVar2 + 1;
  } while (uVar3 != uVar2);
LAB_00634a3b:
  if (uVar3 < 3) {
    do {
      pdVar1[uVar3] = *(double *)((long)local_30 + 0x38 + uVar3 * 8);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

virtual void LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) override {
        mD.segment(block_offset + 0, 3) = GetNodeN(0)->GetPos_dt().eigen();
        mD.segment(block_offset + 3, 3) = GetNodeN(1)->GetPos_dt().eigen();
        mD.segment(block_offset + 6, 3) = GetNodeN(2)->GetPos_dt().eigen();
        mD.segment(block_offset + 9, 3) = GetNodeN(3)->GetPos_dt().eigen();
    }